

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3-prov.c
# Opt level: O2

int blake3_digest_final(void *vctx,uchar *out,size_t *outl,size_t outsz)

{
  blake3_ctx *ctx;
  
  if (*(size_t *)((long)vctx + 8) != 0) {
    outsz = *(size_t *)((long)vctx + 8);
  }
  *outl = outsz;
  if (outsz != 0) {
    blake3_hasher_finalize((blake3_hasher *)((long)vctx + 0x10),out,outsz);
  }
  return 1;
}

Assistant:

int blake3_digest_final(void *vctx, unsigned char *out, size_t *outl,
			size_t outsz)
{
	struct blake3_ctx *ctx = vctx;

	if(ctx->out_len)
		outsz = ctx->out_len;

	*outl = outsz;
	if (outsz != 0)
		blake3_hasher_finalize(&ctx->md, out, outsz);

	return 1;
}